

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent.capnp.h
# Opt level: O0

Request<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::ExportParams,_capnp::Persistent<capnp::AnyPointer,_capnp::AnyPointer>::SaveResults>
* __thiscall
capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::
Client::exportRequest
          (Request<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::ExportParams,_capnp::Persistent<capnp::AnyPointer,_capnp::AnyPointer>::SaveResults>
           *__return_storage_ptr__,Client *this,Maybe<capnp::MessageSize> *sizeHint)

{
  _func_int *p_Var1;
  Maybe<capnp::MessageSize> local_38;
  Maybe<capnp::MessageSize> *local_20;
  Maybe<capnp::MessageSize> *sizeHint_local;
  Client *this_local;
  
  p_Var1 = this->_vptr_Client[-3];
  local_20 = sizeHint;
  sizeHint_local = (Maybe<capnp::MessageSize> *)this;
  this_local = (Client *)__return_storage_ptr__;
  kj::Maybe<capnp::MessageSize>::Maybe(&local_38,sizeHint);
  Capability::Client::
  newCall<capnp::RealmGateway<capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer>::ExportParams,capnp::Persistent<capnp::AnyPointer,capnp::AnyPointer>::SaveResults>
            (__return_storage_ptr__,(Client *)((long)&this->_vptr_Client + (long)p_Var1),
             0x84ff286cd00a3ed4,1,&local_38);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_38);
  return __return_storage_ptr__;
}

Assistant:

RealmGateway<InternalRef, ExternalRef, InternalOwner, ExternalOwner>::Client::exportRequest(::kj::Maybe< ::capnp::MessageSize> sizeHint) {
  return newCall<typename  ::capnp::RealmGateway<InternalRef, ExternalRef, InternalOwner, ExternalOwner>::ExportParams, typename  ::capnp::Persistent<ExternalRef, ExternalOwner>::SaveResults>(
      0x84ff286cd00a3ed4ull, 1, sizeHint);
}